

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utrie2.cpp
# Opt level: O3

void enumEitherTrie(UTrie2 *trie,UChar32 start,UChar32 limit,UTrie2EnumValue *enumValue,
                   UTrie2EnumRange *enumRange,void *context)

{
  int iVar1;
  UNewTrie2 *pUVar2;
  uint32_t *puVar3;
  bool bVar4;
  uint uVar5;
  UBool UVar6;
  uint32_t uVar7;
  uint uVar8;
  uint uVar9;
  uint32_t uVar10;
  uint32_t uVar11;
  code *pcVar12;
  uint32_t **ppuVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  long lVar17;
  uint uVar18;
  ulong uVar19;
  uint uVar20;
  uint32_t uVar21;
  uint local_98;
  uint local_94;
  uint local_90;
  uint local_8c;
  uint16_t *local_80;
  
  if (enumRange == (UTrie2EnumRange *)0x0) {
    return;
  }
  pcVar12 = enumSameValue;
  if (enumValue != (UTrie2EnumValue *)0x0) {
    pcVar12 = enumValue;
  }
  pUVar2 = trie->newTrie;
  if (pUVar2 == (UNewTrie2 *)0x0) {
    local_80 = trie->index;
    ppuVar13 = &trie->data32;
    local_94 = (uint)trie->index2NullOffset;
    local_8c = (uint)trie->dataNullOffset;
  }
  else {
    ppuVar13 = &pUVar2->data;
    local_94 = pUVar2->index2NullOffset;
    local_8c = pUVar2->dataNullOffset;
    local_80 = (uint16_t *)0x0;
  }
  puVar3 = *ppuVar13;
  iVar1 = trie->highStart;
  uVar7 = (*pcVar12)(context,trie->initialValue);
  bVar4 = start < limit;
  uVar21 = 0;
  local_98 = start;
  if (start < iVar1 && bVar4) {
    uVar21 = 0;
    uVar14 = 0xffffffff;
    uVar16 = 0xffffffff;
    do {
      uVar15 = start + 0x800;
      uVar8 = limit;
      if ((int)uVar15 < limit) {
        uVar8 = uVar15;
      }
      uVar11 = uVar21;
      uVar5 = local_98;
      if (start < 0x10000) {
        if ((start & 0xfffff800U) == 0xd800) {
          uVar20 = 0x6c0;
          if ((start & 0x400U) == 0) {
            uVar20 = 0x800;
          }
          uVar8 = (start & 0x400U) + 0xdc00;
          if (limit <= (int)uVar8) {
            uVar8 = limit;
          }
        }
        else {
          uVar20 = start >> 5;
        }
LAB_001bdac3:
        if (uVar20 == local_94) {
          uVar11 = uVar7;
          uVar16 = local_94;
          if (((uVar21 != uVar7) && (uVar14 = local_8c, uVar5 = start, (int)local_98 < start)) &&
             (UVar6 = (*enumRange)(context,local_98,start - 1,uVar21), uVar5 = start, UVar6 == '\0')
             ) {
            return;
          }
        }
        else {
          uVar18 = (uint)start >> 5 & 0x3f;
          uVar19 = (ulong)uVar18;
          uVar9 = uVar8 >> 5 & 0x3f;
          if (0x7ff < (uVar8 ^ start)) {
            uVar9 = 0x40;
          }
          uVar15 = start;
          uVar16 = uVar20;
          if (uVar18 < uVar9) {
            do {
              if (local_80 == (uint16_t *)0x0) {
                uVar15 = trie->newTrie->index2[(long)(int)uVar20 + uVar19];
              }
              else {
                uVar15 = (uint)local_80[(long)(int)uVar20 + uVar19] << 2;
              }
              if ((uVar15 == uVar14) && (0x1f < (int)(start - local_98))) {
                start = start + 0x20;
              }
              else if (uVar15 == local_8c) {
                uVar15 = local_98;
                if (((uVar21 != uVar7) && (uVar15 = start, (int)local_98 < start)) &&
                   (UVar6 = (*enumRange)(context,local_98,start - 1,uVar21), UVar6 == '\0')) {
                  return;
                }
                start = start + 0x20;
                uVar21 = uVar7;
                uVar14 = local_8c;
                local_98 = uVar15;
              }
              else {
                lVar17 = 0;
                do {
                  if (puVar3 == (uint32_t *)0x0) {
                    uVar11 = (uint32_t)*(ushort *)((long)local_80 + lVar17 + (long)(int)uVar15 * 2);
                  }
                  else {
                    uVar11 = *(uint32_t *)((long)puVar3 + lVar17 * 2 + (long)(int)uVar15 * 4);
                  }
                  uVar10 = (*pcVar12)(context,uVar11);
                  uVar11 = uVar21;
                  uVar14 = local_98;
                  if (((uVar10 != uVar21) &&
                      (uVar11 = uVar10, uVar14 = start, (int)local_98 < start)) &&
                     (UVar6 = (*enumRange)(context,local_98,start - 1,uVar21), uVar14 = start,
                     UVar6 == '\0')) {
                    return;
                  }
                  local_98 = uVar14;
                  uVar21 = uVar11;
                  start = start + 1;
                  lVar17 = lVar17 + 2;
                  uVar14 = uVar15;
                } while (lVar17 != 0x40);
              }
              uVar19 = uVar19 + 1;
              uVar11 = uVar21;
              uVar5 = local_98;
              uVar15 = start;
            } while (uVar19 != uVar9);
          }
        }
      }
      else {
        if (local_80 == (uint16_t *)0x0) {
          uVar20 = trie->newTrie->index1[(uint)start >> 0xb];
        }
        else {
          uVar20 = (uint)local_80[(ulong)((uint)start >> 0xb) + 0x820];
        }
        if ((uVar20 != uVar16) || ((int)(start - local_98) < 0x800)) goto LAB_001bdac3;
      }
      start = uVar15;
      local_98 = uVar5;
      uVar21 = uVar11;
      bVar4 = start < limit;
    } while ((start < limit) && (start < iVar1));
  }
  local_90 = limit;
  if (start < limit) {
    local_90 = start;
  }
  uVar14 = local_98;
  uVar7 = uVar21;
  if (bVar4) {
    if (local_80 == (uint16_t *)0x0) {
      uVar11 = trie->newTrie->data[(long)trie->newTrie->dataLength + -4];
    }
    else if (puVar3 == (uint32_t *)0x0) {
      uVar11 = (uint32_t)local_80[trie->highValueIndex];
    }
    else {
      uVar11 = puVar3[trie->highValueIndex];
    }
    uVar11 = (*pcVar12)(context,uVar11);
    local_90 = limit;
    if (((uVar11 != uVar21) && (uVar14 = start, uVar7 = uVar11, (int)local_98 < start)) &&
       (UVar6 = (*enumRange)(context,local_98,start - 1,uVar21), UVar6 == '\0')) {
      return;
    }
  }
  (*enumRange)(context,uVar14,local_90 - 1,uVar7);
  return;
}

Assistant:

static void
enumEitherTrie(const UTrie2 *trie,
               UChar32 start, UChar32 limit,
               UTrie2EnumValue *enumValue, UTrie2EnumRange *enumRange, const void *context) {
    const uint32_t *data32;
    const uint16_t *idx;

    uint32_t value, prevValue, initialValue;
    UChar32 c, prev, highStart;
    int32_t j, i2Block, prevI2Block, index2NullOffset, block, prevBlock, nullBlock;

    if(enumRange==NULL) {
        return;
    }
    if(enumValue==NULL) {
        enumValue=enumSameValue;
    }

    if(trie->newTrie==NULL) {
        /* frozen trie */
        idx=trie->index;
        U_ASSERT(idx!=NULL); /* the following code assumes trie->newTrie is not NULL when idx is NULL */
        data32=trie->data32;

        index2NullOffset=trie->index2NullOffset;
        nullBlock=trie->dataNullOffset;
    } else {
        /* unfrozen, mutable trie */
        idx=NULL;
        data32=trie->newTrie->data;
        U_ASSERT(data32!=NULL); /* the following code assumes idx is not NULL when data32 is NULL */

        index2NullOffset=trie->newTrie->index2NullOffset;
        nullBlock=trie->newTrie->dataNullOffset;
    }

    highStart=trie->highStart;

    /* get the enumeration value that corresponds to an initial-value trie data entry */
    initialValue=enumValue(context, trie->initialValue);

    /* set variables for previous range */
    prevI2Block=-1;
    prevBlock=-1;
    prev=start;
    prevValue=0;

    /* enumerate index-2 blocks */
    for(c=start; c<limit && c<highStart;) {
        /* Code point limit for iterating inside this i2Block. */
        UChar32 tempLimit=c+UTRIE2_CP_PER_INDEX_1_ENTRY;
        if(limit<tempLimit) {
            tempLimit=limit;
        }
        if(c<=0xffff) {
            if(!U_IS_SURROGATE(c)) {
                i2Block=c>>UTRIE2_SHIFT_2;
            } else if(U_IS_SURROGATE_LEAD(c)) {
                /*
                 * Enumerate values for lead surrogate code points, not code units:
                 * This special block has half the normal length.
                 */
                i2Block=UTRIE2_LSCP_INDEX_2_OFFSET;
                tempLimit=MIN_VALUE(0xdc00, limit);
            } else {
                /*
                 * Switch back to the normal part of the index-2 table.
                 * Enumerate the second half of the surrogates block.
                 */
                i2Block=0xd800>>UTRIE2_SHIFT_2;
                tempLimit=MIN_VALUE(0xe000, limit);
            }
        } else {
            /* supplementary code points */
            if(idx!=NULL) {
                i2Block=idx[(UTRIE2_INDEX_1_OFFSET-UTRIE2_OMITTED_BMP_INDEX_1_LENGTH)+
                              (c>>UTRIE2_SHIFT_1)];
            } else {
                i2Block=trie->newTrie->index1[c>>UTRIE2_SHIFT_1];
            }
            if(i2Block==prevI2Block && (c-prev)>=UTRIE2_CP_PER_INDEX_1_ENTRY) {
                /*
                 * The index-2 block is the same as the previous one, and filled with prevValue.
                 * Only possible for supplementary code points because the linear-BMP index-2
                 * table creates unique i2Block values.
                 */
                c+=UTRIE2_CP_PER_INDEX_1_ENTRY;
                continue;
            }
        }
        prevI2Block=i2Block;
        if(i2Block==index2NullOffset) {
            /* this is the null index-2 block */
            if(prevValue!=initialValue) {
                if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                    return;
                }
                prevBlock=nullBlock;
                prev=c;
                prevValue=initialValue;
            }
            c+=UTRIE2_CP_PER_INDEX_1_ENTRY;
        } else {
            /* enumerate data blocks for one index-2 block */
            int32_t i2, i2Limit;
            i2=(c>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
            if((c>>UTRIE2_SHIFT_1)==(tempLimit>>UTRIE2_SHIFT_1)) {
                i2Limit=(tempLimit>>UTRIE2_SHIFT_2)&UTRIE2_INDEX_2_MASK;
            } else {
                i2Limit=UTRIE2_INDEX_2_BLOCK_LENGTH;
            }
            for(; i2<i2Limit; ++i2) {
                if(idx!=NULL) {
                    block=(int32_t)idx[i2Block+i2]<<UTRIE2_INDEX_SHIFT;
                } else {
                    block=trie->newTrie->index2[i2Block+i2];
                }
                if(block==prevBlock && (c-prev)>=UTRIE2_DATA_BLOCK_LENGTH) {
                    /* the block is the same as the previous one, and filled with prevValue */
                    c+=UTRIE2_DATA_BLOCK_LENGTH;
                    continue;
                }
                prevBlock=block;
                if(block==nullBlock) {
                    /* this is the null data block */
                    if(prevValue!=initialValue) {
                        if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                            return;
                        }
                        prev=c;
                        prevValue=initialValue;
                    }
                    c+=UTRIE2_DATA_BLOCK_LENGTH;
                } else {
                    for(j=0; j<UTRIE2_DATA_BLOCK_LENGTH; ++j) {
                        value=enumValue(context, data32!=NULL ? data32[block+j] : idx[block+j]);
                        if(value!=prevValue) {
                            if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                                return;
                            }
                            prev=c;
                            prevValue=value;
                        }
                        ++c;
                    }
                }
            }
        }
    }

    if(c>limit) {
        c=limit;  /* could be higher if in the index2NullOffset */
    } else if(c<limit) {
        /* c==highStart<limit */
        uint32_t highValue;
        if(idx!=NULL) {
            highValue=
                data32!=NULL ?
                    data32[trie->highValueIndex] :
                    idx[trie->highValueIndex];
        } else {
            highValue=trie->newTrie->data[trie->newTrie->dataLength-UTRIE2_DATA_GRANULARITY];
        }
        value=enumValue(context, highValue);
        if(value!=prevValue) {
            if(prev<c && !enumRange(context, prev, c-1, prevValue)) {
                return;
            }
            prev=c;
            prevValue=value;
        }
        c=limit;
    }

    /* deliver last range */
    enumRange(context, prev, c-1, prevValue);
}